

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

Value * __thiscall Json::Value::append(Value *this,Value *value)

{
  ushort uVar1;
  ValueHolder VVar2;
  ValueHolder VVar3;
  ValueHolder VVar4;
  ValueHolder VVar5;
  ArrayIndex index;
  ValueHolder *pVVar6;
  ValueHolder local_30;
  ushort local_28;
  ValueHolder local_20;
  ValueHolder local_18;
  ValueHolder VStack_10;
  
  Value((Value *)&local_30,value);
  index = size(this);
  pVVar6 = &operator[](this,index)->value_;
  uVar1 = *(ushort *)(pVVar6 + 1);
  *(ushort *)(pVVar6 + 1) = uVar1 & 0xff00 | local_28 & 0xff;
  VVar2 = *pVVar6;
  *pVVar6 = local_30;
  *(ushort *)(pVVar6 + 1) = uVar1 & 0xfe00 | local_28 & 0xff | local_28 & 0x100;
  local_28 = local_28 & 0xfe00 | uVar1 & 0xff | uVar1 & 0x100;
  VVar3 = pVVar6[2];
  pVVar6[2] = local_20;
  VVar4 = pVVar6[3];
  VVar5 = pVVar6[4];
  pVVar6[3] = local_18;
  pVVar6[4] = VStack_10;
  local_30 = VVar2;
  local_20 = VVar3;
  local_18 = VVar4;
  VStack_10 = VVar5;
  ~Value((Value *)&local_30);
  return (Value *)pVVar6;
}

Assistant:

Value& Value::append(const Value& value) { return (*this)[size()] = value; }